

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFieldToObject
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  bool bVar1;
  FieldDescriptor FVar2;
  CppType CVar3;
  Type TVar4;
  FieldDescriptor *pFVar5;
  GeneratorOptions *options_00;
  string *__return_storage_ptr__;
  BytesMode in_R8D;
  undefined1 in_R9B;
  string value_to_object;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  __return_storage_ptr__ = &value_to_object;
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)field,(GeneratorOptions *)printer,field
            );
  io::Printer::Print(printer,"$fieldname$: ","fieldname",__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&value_to_object);
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    pFVar5 = anon_unknown_0::MapFieldValue(field);
    value_to_object._M_dataplus._M_p = (pointer)&value_to_object.field_2;
    value_to_object._M_string_length = 0;
    value_to_object.field_2._M_local_buf[0] = '\0';
    CVar3 = FieldDescriptor::cpp_type(pFVar5);
    if (CVar3 == CPPTYPE_MESSAGE) {
      options_00 = (GeneratorOptions *)FieldDescriptor::message_type(pFVar5);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&local_40,(_anonymous_namespace_ *)options,options_00,
                 (Descriptor *)__return_storage_ptr__);
      std::operator+(&local_60,&local_40,".toObject");
      std::__cxx11::string::operator=((string *)&value_to_object,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
    }
    else {
      std::__cxx11::string::assign((char *)&value_to_object);
    }
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&local_60,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,in_R8D,(bool)in_R9B);
    io::Printer::Print(printer,
                       "(f = msg.get$name$()) ? f.toObject(includeInstance, $valuetoobject$) : []",
                       "name",&local_60,"valuetoobject",&value_to_object);
  }
  else {
    CVar3 = FieldDescriptor::cpp_type(field);
    if (CVar3 != CPPTYPE_MESSAGE) {
      pFVar5 = field;
      TVar4 = FieldDescriptor::type(field);
      if (TVar4 != TYPE_BYTES) {
        FVar2 = field[0x98];
        if (*(int *)(*(long *)(field + 0x30) + 0x8c) == 3) {
          FVar2 = (FieldDescriptor)((byte)FVar2 | *(int *)(field + 0x4c) != 3);
        }
        GenerateFieldValueExpression
                  ((Generator *)pFVar5,printer,"msg",field,(bool)((byte)FVar2 & 1));
        return;
      }
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (&value_to_object,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x1,
                 (FieldDescriptor *)0x0,in_R8D,(bool)in_R9B);
      io::Printer::Print(printer,"msg.get$getter$()","getter",&value_to_object);
      goto LAB_00255d54;
    }
    if (*(int *)(field + 0x4c) == 3) {
      pFVar5 = (FieldDescriptor *)0x0;
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (&value_to_object,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                 (FieldDescriptor *)0x0,in_R8D,(bool)in_R9B);
      (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                (&local_60,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,pFVar5);
      io::Printer::Print(printer,
                         "jspb.Message.toObjectList(msg.get$getter$(),\n    $type$.toObject, includeInstance)"
                         ,"getter",&value_to_object,"type",&local_60);
    }
    else {
      pFVar5 = (FieldDescriptor *)0x0;
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (&value_to_object,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                 (FieldDescriptor *)0x0,in_R8D,(bool)in_R9B);
      (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                (&local_60,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,pFVar5);
      io::Printer::Print(printer,"(f = msg.get$getter$()) && $type$.toObject(includeInstance, f)",
                         "getter",&value_to_object,"type",&local_60);
    }
  }
  std::__cxx11::string::~string((string *)&local_60);
LAB_00255d54:
  std::__cxx11::string::~string((string *)&value_to_object);
  return;
}

Assistant:

void Generator::GenerateClassFieldToObject(const GeneratorOptions& options,
                                           io::Printer* printer,
                                           const FieldDescriptor* field) const {
  printer->Print("$fieldname$: ",
                 "fieldname", JSObjectFieldName(options, field));

  if (IsMap(options, field)) {
    const FieldDescriptor* value_field = MapFieldValue(field);
    // If the map values are of a message type, we must provide their static
    // toObject() method; otherwise we pass undefined for that argument.
    string value_to_object;
    if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      value_to_object =
          GetMessagePath(options, value_field->message_type()) + ".toObject";
    } else {
      value_to_object = "undefined";
    }
    printer->Print(
        "(f = msg.get$name$()) ? f.toObject(includeInstance, $valuetoobject$) "
        ": []",
        "name", JSGetterName(options, field), "valuetoobject", value_to_object);
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    // Message field.
    if (field->is_repeated()) {
      {
        printer->Print("jspb.Message.toObjectList(msg.get$getter$(),\n"
                       "    $type$.toObject, includeInstance)",
                       "getter", JSGetterName(options, field),
                       "type", SubmessageTypeRef(options, field));
      }
    } else {
      printer->Print("(f = msg.get$getter$()) && "
                     "$type$.toObject(includeInstance, f)",
                     "getter", JSGetterName(options, field),
                     "type", SubmessageTypeRef(options, field));
    }
  } else if (field->type() == FieldDescriptor::TYPE_BYTES) {
    // For bytes fields we want to always return the B64 data.
    printer->Print("msg.get$getter$()",
                   "getter", JSGetterName(options, field, BYTES_B64));
  } else {
    bool use_default = field->has_default_value();

    if (field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3 &&
        // Repeated fields get initialized to their default in the constructor
        // (why?), so we emit a plain getField() call for them.
        !field->is_repeated() && !UseBrokenPresenceSemantics(options, field)) {
      // Proto3 puts all defaults (including implicit defaults) in toObject().
      // But for proto2 we leave the existing semantics unchanged: unset fields
      // without default are unset.
      use_default = true;
    }

    // We don't implement this by calling the accessors, because the semantics
    // of the accessors are changing independently of the toObject() semantics.
    // We are migrating the accessors to return defaults instead of null, but
    // it may take longer to migrate toObject (or we might not want to do it at
    // all).  So we want to generate independent code.
    GenerateFieldValueExpression(printer, "msg", field, use_default);
  }
}